

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::LookupLinkItems
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names,vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items)

{
  __type _Var1;
  cmTarget *pcVar2;
  pointer item;
  string name;
  string local_78;
  cmLinkItem local_58;
  
  for (item = (names->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      item != (names->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish; item = item + 1) {
    CheckCMP0004(&local_78,this,item);
    _Var1 = std::operator==(&local_78,&this->Name);
    if ((!_Var1) && (local_78._M_string_length != 0)) {
      pcVar2 = FindTargetToLink(this,&local_78);
      std::__cxx11::string::string((string *)&local_58,(string *)&local_78);
      local_58.Target = pcVar2;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                (items,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void cmTarget::LookupLinkItems(std::vector<std::string> const& names,
                               std::vector<cmLinkItem>& items) const
{
  for(std::vector<std::string>::const_iterator i = names.begin();
      i != names.end(); ++i)
    {
    std::string name = this->CheckCMP0004(*i);
    if(name == this->GetName() || name.empty())
      {
      continue;
      }
    items.push_back(cmLinkItem(name, this->FindTargetToLink(name)));
    }
}